

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.hpp
# Opt level: O2

void * Platform::safeRealloc(void *p,size_t size)

{
  void *pvVar1;
  
  if (p == (void *)0x0 && size == 0) {
    return (void *)0x0;
  }
  if ((size != 0) && (pvVar1 = realloc(p,size), pvVar1 != (void *)0x0)) {
    return pvVar1;
  }
  free(p);
  return (void *)0x0;
}

Assistant:

inline void * safeRealloc(void * p, size_t size) 
    {
        if (p == 0 && size == 0) return 0;
        if (size == 0)
        {
            free(p);
            return 0; // On FreeBSD realloc(ptr, 0) frees ptr BUT allocates a 0 sized buffer.
        }
        void * other = realloc(p, size);
        if (size && other == NULL)
            free(p); // Reallocation fails, let's free the previous pointer

        return other;
    }